

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiMessage.cpp
# Opt level: O0

void __thiscall smf::MidiMessage::setMetaContent(MidiMessage *this,string *content)

{
  size_type sVar1;
  reference pvVar2;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __last;
  back_insert_iterator<smf::MidiMessage> __result;
  byte local_22;
  byte local_21;
  byte local_20;
  byte local_1f;
  byte local_1e;
  byte local_1d;
  uchar byte5;
  int iStack_1c;
  uchar byte4;
  uchar byte3;
  uchar byte2;
  uchar byte1;
  int dsize;
  string *content_local;
  MidiMessage *this_local;
  
  _byte3 = content;
  content_local = (string *)this;
  sVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>);
  if ((1 < sVar1) &&
     (pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,0),
     *pvVar2 == 0xff)) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,2);
    iStack_1c = std::__cxx11::string::size();
    if (iStack_1c < 0x80) {
      local_1d = (byte)iStack_1c;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,&local_1d);
    }
    else {
      local_1e = (byte)iStack_1c & 0x7f;
      local_1f = (byte)(iStack_1c >> 7) & 0x7f;
      local_20 = (byte)(iStack_1c >> 0xe) & 0x7f;
      local_21 = (byte)(iStack_1c >> 0x15) & 0x7f;
      local_22 = (byte)(iStack_1c >> 0x1c) & 0x7f;
      if (local_22 != 0) {
        local_21 = local_21 | 0x80;
      }
      if (local_21 != 0) {
        local_21 = local_21 | 0x80;
        local_20 = local_20 | 0x80;
      }
      if (local_20 != 0) {
        local_20 = local_20 | 0x80;
        local_1f = local_1f | 0x80;
      }
      if (local_1f != 0) {
        local_1f = local_1f | 0x80;
      }
      if (local_22 != 0) {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                  (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,&local_22);
      }
      if (local_21 != 0) {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                  (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,&local_21);
      }
      if (local_20 != 0) {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                  (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,&local_20);
      }
      if (local_1f != 0) {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                  (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,&local_1f);
      }
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,&local_1e);
    }
    __first._M_current = (char *)std::__cxx11::string::begin();
    __last._M_current = (char *)std::__cxx11::string::end();
    __result = std::back_inserter<smf::MidiMessage>(this);
    std::
    copy<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::back_insert_iterator<smf::MidiMessage>>
              (__first,__last,__result);
  }
  return;
}

Assistant:

void MidiMessage::setMetaContent(const std::string& content) {
	if (this->size() < 2) {
		// invalid message, so ignore request
		return;
	}
	if (operator[](0) != 0xFF) {
		// not a meta message, so ignore request
		return;
	}
	this->resize(2);
	
	// add the size of the meta message data (VLV)
	int dsize = (int)content.size();
	if (dsize < 128) {
		push_back((uchar)dsize);
	} else {
		// calculate VLV bytes and insert into message
		uchar byte1 = dsize & 0x7f;
		uchar byte2 = (dsize >>  7) & 0x7f;
		uchar byte3 = (dsize >> 14) & 0x7f;
		uchar byte4 = (dsize >> 21) & 0x7f;
		uchar byte5 = (dsize >> 28) & 0x7f;
		if (byte5) {
			byte4 |= 0x80;
		}
		if (byte4) {
			byte4 |= 0x80;
			byte3 |= 0x80;
		}
		if (byte3) {
			byte3 |= 0x80;
			byte2 |= 0x80;
		}
		if (byte2) {
			byte2 |= 0x80;
		}
		if (byte5) { push_back(byte5); }
		if (byte4) { push_back(byte4); }
		if (byte3) { push_back(byte3); }
		if (byte2) { push_back(byte2); }
		push_back(byte1);
	}
	std::copy(content.begin(), content.end(), std::back_inserter(*this));
}